

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmFor(ExpressionContext *ctx,VmModule *module,ExprFor *node)

{
  VmBlock *expr;
  VmModule *ctx_00;
  ExprBase **this;
  VmValue *pVVar1;
  VmValue *condition;
  VmBlock *local_40;
  VmBlock *exitBlock;
  VmBlock *iterationBlock;
  VmBlock *bodyBlock;
  VmBlock *conditionBlock;
  ExprFor *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  conditionBlock = (VmBlock *)node;
  node_local = (ExprFor *)module;
  module_local = (VmModule *)ctx;
  CompileVm(ctx,module,node->initializer);
  bodyBlock = anon_unknown.dwarf_1a3010::CreateBlock
                        ((VmModule *)node_local,*(SynBase **)&(conditionBlock->super_VmValue).type,
                         "for_cond");
  iterationBlock =
       anon_unknown.dwarf_1a3010::CreateBlock
                 ((VmModule *)node_local,*(SynBase **)&(conditionBlock->super_VmValue).type,
                  "for_body");
  exitBlock = anon_unknown.dwarf_1a3010::CreateBlock
                        ((VmModule *)node_local,*(SynBase **)&(conditionBlock->super_VmValue).type,
                         "for_iter");
  local_40 = anon_unknown.dwarf_1a3010::CreateBlock
                       ((VmModule *)node_local,*(SynBase **)&(conditionBlock->super_VmValue).type,
                        "for_exit");
  this = &node_local->condition;
  VmModule::LoopInfo::LoopInfo((LoopInfo *)&condition,local_40,exitBlock);
  SmallArray<VmModule::LoopInfo,_32U>::push_back
            ((SmallArray<VmModule::LoopInfo,_32U> *)this,(LoopInfo *)&condition);
  anon_unknown.dwarf_1a3010::CreateJump
            ((VmModule *)node_local,*(SynBase **)&(conditionBlock->super_VmValue).type,
             &bodyBlock->super_VmValue);
  VmFunction::AddBlock(*(VmFunction **)&(node_local->super_ExprBase).listed,bodyBlock);
  node_local->initializer = (ExprBase *)bodyBlock;
  pVVar1 = CompileVm((ExpressionContext *)module_local,(VmModule *)node_local,
                     *(ExprBase **)&(conditionBlock->super_VmValue).hasSideEffects);
  anon_unknown.dwarf_1a3010::CreateJumpNotZero
            ((VmModule *)node_local,*(SynBase **)&(conditionBlock->super_VmValue).type,pVVar1,
             &iterationBlock->super_VmValue,&local_40->super_VmValue);
  VmFunction::AddBlock(*(VmFunction **)&(node_local->super_ExprBase).listed,iterationBlock);
  node_local->initializer = (ExprBase *)iterationBlock;
  CompileVm((ExpressionContext *)module_local,(VmModule *)node_local,
            *(ExprBase **)&(conditionBlock->super_VmValue).users.count);
  anon_unknown.dwarf_1a3010::CreateJump
            ((VmModule *)node_local,*(SynBase **)&(conditionBlock->super_VmValue).type,
             &exitBlock->super_VmValue);
  VmFunction::AddBlock(*(VmFunction **)&(node_local->super_ExprBase).listed,exitBlock);
  node_local->initializer = (ExprBase *)exitBlock;
  CompileVm((ExpressionContext *)module_local,(VmModule *)node_local,
            (ExprBase *)(conditionBlock->super_VmValue).users.data);
  anon_unknown.dwarf_1a3010::CreateJump
            ((VmModule *)node_local,*(SynBase **)&(conditionBlock->super_VmValue).type,
             &bodyBlock->super_VmValue);
  VmFunction::AddBlock(*(VmFunction **)&(node_local->super_ExprBase).listed,local_40);
  node_local->initializer = (ExprBase *)local_40;
  SmallArray<VmModule::LoopInfo,_32U>::pop_back
            ((SmallArray<VmModule::LoopInfo,_32U> *)&node_local->condition);
  ctx_00 = module_local;
  expr = conditionBlock;
  pVVar1 = anon_unknown.dwarf_1a3010::CreateVoid((VmModule *)node_local);
  pVVar1 = anon_unknown.dwarf_1a3010::CheckType((ExpressionContext *)ctx_00,(ExprBase *)expr,pVVar1)
  ;
  return pVVar1;
}

Assistant:

VmValue* CompileVmFor(ExpressionContext &ctx, VmModule *module, ExprFor *node)
{
	CompileVm(ctx, module, node->initializer);

	VmBlock *conditionBlock = CreateBlock(module, node->source, "for_cond");
	VmBlock *bodyBlock = CreateBlock(module, node->source, "for_body");
	VmBlock *iterationBlock = CreateBlock(module, node->source, "for_iter");
	VmBlock *exitBlock = CreateBlock(module, node->source, "for_exit");

	module->loopInfo.push_back(VmModule::LoopInfo(exitBlock, iterationBlock));

	CreateJump(module, node->source, conditionBlock);

	module->currentFunction->AddBlock(conditionBlock);
	module->currentBlock = conditionBlock;

	VmValue* condition = CompileVm(ctx, module, node->condition);

	CreateJumpNotZero(module, node->source, condition, bodyBlock, exitBlock);

	module->currentFunction->AddBlock(bodyBlock);
	module->currentBlock = bodyBlock;

	CompileVm(ctx, module, node->body);

	CreateJump(module, node->source, iterationBlock);

	module->currentFunction->AddBlock(iterationBlock);
	module->currentBlock = iterationBlock;

	CompileVm(ctx, module, node->increment);

	CreateJump(module, node->source, conditionBlock);

	module->currentFunction->AddBlock(exitBlock);
	module->currentBlock = exitBlock;

	module->loopInfo.pop_back();

	return CheckType(ctx, node, CreateVoid(module));
}